

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_bson_parser<std::__cxx11::istringstream&>
          (basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          bson_decode_options *options,allocator<char> *temp_alloc)

{
  allocator *in_RCX;
  ser_context *in_RDI;
  allocator<char> *__a;
  bson_decode_options *in_stack_ffffffffffffff80;
  allocator<unsigned_char> *this_00;
  int *__args_2;
  string *this_01;
  string *this_02;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_03;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  stream_source<unsigned_char> *in_stack_ffffffffffffffd0;
  
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_bson_parser_01334998;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  stream_source<unsigned_char>::stream_source
            (in_stack_ffffffffffffffd0,
             (basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  __a = (allocator<char> *)(in_RDI + 0x35);
  bson_decode_options::bson_decode_options(in_stack_ffffffffffffff80,(bson_decode_options *)__a);
  this_00 = (allocator<unsigned_char> *)(in_RDI + 0x38);
  __args_2 = (int *)&stack0xffffffffffffffd3;
  std::allocator<unsigned_char>::allocator<char>(this_00,__a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(allocator_type *)__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x22a7e3);
  this_01 = (string *)(in_RDI + 0x3b);
  std::__cxx11::string::string(this_01,in_RCX);
  this_02 = (string *)(in_RDI + 0x3f);
  std::__cxx11::string::string(this_02,in_RCX);
  this_03 = (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
            &stack0xffffffffffffffd2;
  std::allocator<jsoncons::bson::parse_state>::allocator<char>
            ((allocator<jsoncons::bson::parse_state> *)this_00,__a);
  std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::vector
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             this_00,(allocator_type *)__a);
  std::allocator<jsoncons::bson::parse_state>::~allocator
            ((allocator<jsoncons::bson::parse_state> *)0x22a856);
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            (this_03,(parse_mode *)this_02,(int *)this_01,__args_2);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }